

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O3

word Abc_Isop14Cover(word *pOn,word *pOnDc,word *pRes,word CostLim,int *pCover)

{
  word *pwVar1;
  int *piVar2;
  uint *puVar3;
  byte *pbVar4;
  word *pwVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  word wVar22;
  word wVar23;
  word wVar24;
  ulong uVar25;
  ulong uVar26;
  int *piVar27;
  word uOn2 [128];
  word uRes1 [128];
  word uRes0 [128];
  word uRes2 [128];
  word uOnDc2 [128];
  undefined8 local_1438;
  uint auStack_1430 [254];
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_c38;
  undefined8 uStack_c30;
  word local_838;
  ulong auStack_830 [127];
  undefined8 local_438;
  uint auStack_430 [256];
  
  lVar21 = 0;
  do {
    pwVar1 = pOn + lVar21;
    uVar7 = *(uint *)((long)pwVar1 + 4);
    wVar22 = pwVar1[1];
    uVar8 = *(uint *)((long)pwVar1 + 0xc);
    pwVar5 = pOnDc + lVar21 + 0x80;
    uVar9 = *(uint *)((long)pwVar5 + 4);
    wVar23 = pwVar5[1];
    uVar10 = *(uint *)((long)pwVar5 + 0xc);
    *(uint *)(&local_1438 + lVar21) = ~(uint)*pwVar5 & (uint)*pwVar1;
    auStack_1430[lVar21 * 2 + -1] = ~uVar9 & uVar7;
    auStack_1430[lVar21 * 2] = ~(uint)wVar23 & (uint)wVar22;
    auStack_1430[lVar21 * 2 + 1] = ~uVar10 & uVar8;
    lVar21 = lVar21 + 2;
  } while (lVar21 != 0x80);
  wVar22 = Abc_IsopCheck(&local_1438,pOnDc,&local_c38,0xd,CostLim,pCover);
  if (wVar22 < CostLim) {
    lVar21 = 0;
    do {
      pwVar5 = pOn + lVar21 + 0x80;
      uVar7 = *(uint *)((long)pwVar5 + 4);
      wVar23 = pwVar5[1];
      uVar8 = *(uint *)((long)pwVar5 + 0xc);
      pwVar1 = pOnDc + lVar21;
      uVar9 = *(uint *)((long)pwVar1 + 4);
      wVar24 = pwVar1[1];
      uVar10 = *(uint *)((long)pwVar1 + 0xc);
      *(uint *)(&local_1438 + lVar21) = ~(uint)*pwVar1 & (uint)*pwVar5;
      auStack_1430[lVar21 * 2 + -1] = ~uVar9 & uVar7;
      auStack_1430[lVar21 * 2] = ~(uint)wVar24 & (uint)wVar23;
      auStack_1430[lVar21 * 2 + 1] = ~uVar10 & uVar8;
      lVar21 = lVar21 + 2;
    } while (lVar21 != 0x80);
    piVar2 = pCover + ((long)wVar22 >> 0x20);
    piVar27 = piVar2;
    if (pCover == (int *)0x0) {
      piVar27 = (int *)0x0;
    }
    wVar23 = Abc_IsopCheck(&local_1438,pOnDc + 0x80,&local_1038,0xd,CostLim,piVar27);
    if (wVar23 + wVar22 < CostLim) {
      lVar21 = 0;
      do {
        puVar3 = (uint *)((long)pOn + lVar21);
        uVar7 = puVar3[1];
        uVar8 = puVar3[2];
        uVar9 = puVar3[3];
        uVar10 = *(uint *)((long)&local_c38 + lVar21 + 4);
        uVar11 = *(uint *)((long)&uStack_c30 + lVar21);
        uVar12 = *(uint *)((long)&uStack_c30 + lVar21 + 4);
        puVar6 = (uint *)((long)pOn + lVar21 + 0x400);
        uVar13 = puVar6[1];
        uVar14 = puVar6[2];
        uVar15 = puVar6[3];
        uVar16 = *(uint *)((long)&local_1038 + lVar21 + 4);
        uVar17 = *(uint *)((long)&uStack_1030 + lVar21);
        uVar18 = *(uint *)((long)&uStack_1030 + lVar21 + 4);
        *(uint *)((long)&local_1438 + lVar21) =
             ~*(uint *)((long)&local_1038 + lVar21) & *puVar6 |
             ~*(uint *)((long)&local_c38 + lVar21) & *puVar3;
        *(uint *)((long)auStack_1430 + lVar21 + -4) = ~uVar16 & uVar13 | ~uVar10 & uVar7;
        *(uint *)((long)auStack_1430 + lVar21) = ~uVar17 & uVar14 | ~uVar11 & uVar8;
        *(uint *)((long)auStack_1430 + lVar21 + 4) = ~uVar18 & uVar15 | ~uVar12 & uVar9;
        puVar3 = (uint *)((long)pOnDc + lVar21);
        uVar7 = puVar3[1];
        uVar8 = puVar3[2];
        uVar9 = puVar3[3];
        puVar6 = (uint *)((long)pOnDc + lVar21 + 0x400);
        uVar10 = puVar6[1];
        uVar11 = puVar6[2];
        uVar12 = puVar6[3];
        *(uint *)((long)&local_438 + lVar21) = *puVar6 & *puVar3;
        *(uint *)((long)auStack_430 + lVar21 + -4) = uVar10 & uVar7;
        *(uint *)((long)auStack_430 + lVar21) = uVar11 & uVar8;
        *(uint *)((long)auStack_430 + lVar21 + 4) = uVar12 & uVar9;
        lVar21 = lVar21 + 0x10;
      } while (lVar21 != 0x400);
      piVar27 = piVar2 + ((long)wVar23 >> 0x20);
      if (pCover == (int *)0x0) {
        piVar27 = (int *)0x0;
      }
      wVar24 = Abc_IsopCheck(&local_1438,&local_438,&local_838,0xd,CostLim,piVar27);
      uVar25 = wVar24 + wVar23 + wVar22;
      if (uVar25 < CostLim) {
        lVar21 = 0;
        do {
          uVar26 = auStack_830[lVar21 + -1];
          uVar19 = auStack_830[lVar21];
          uVar20 = (&uStack_c30)[lVar21];
          pRes[lVar21] = (&local_c38)[lVar21] | uVar26;
          (pRes + lVar21)[1] = uVar20 | uVar19;
          uVar20 = (&uStack_1030)[lVar21];
          pRes[lVar21 + 0x80] = uVar26 | (&local_1038)[lVar21];
          (pRes + lVar21 + 0x80)[1] = uVar19 | uVar20;
          lVar21 = lVar21 + 2;
        } while (lVar21 != 0x80);
        lVar21 = 0;
        do {
          if (((pOn[lVar21] & ~pRes[lVar21]) != 0) || ((pRes[lVar21] & ~pOnDc[lVar21]) != 0)) {
            __assert_fail("(pOn[c] & ~pRes[c] ) == 0 && (pRes[c] & ~pOnDc[c]) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                          ,0x170,"word Abc_Isop14Cover(word *, word *, word *, word, int *)");
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != 0x100);
        if (pCover != (int *)0x0) {
          if (0 < (int)(wVar22 >> 0x20)) {
            uVar26 = 0;
            do {
              pbVar4 = (byte *)((long)pCover + uVar26 * 4 + 3);
              *pbVar4 = *pbVar4 | 4;
              uVar26 = uVar26 + 1;
            } while (wVar22 >> 0x20 != uVar26);
          }
          if (0 < (int)(wVar23 >> 0x20)) {
            uVar26 = 0;
            do {
              pbVar4 = (byte *)((long)piVar2 + uVar26 * 4 + 3);
              *pbVar4 = *pbVar4 | 8;
              uVar26 = uVar26 + 1;
            } while (wVar23 >> 0x20 != uVar26);
          }
        }
        CostLim = ((long)wVar23 >> 0x20) + ((long)wVar22 >> 0x20) + uVar25;
      }
    }
  }
  return CostLim;
}

Assistant:

word Abc_Isop14Cover( word * pOn, word * pOnDc, word * pRes, word CostLim, int * pCover )
{
    word uOn2[128], uOnDc2[128], uRes0[128], uRes1[128], uRes2[128];
    word Cost0, Cost1, Cost2; int c, nVars = 13, nWords = 128;
    // negative cofactor
    for ( c = 0; c < nWords; c++ )
        uOn2[c] = pOn[c] & ~pOnDc[c+nWords];
    Cost0 = Abc_IsopCheck( uOn2, pOnDc,        uRes0, nVars, CostLim, pCover );
    if ( Cost0 >= CostLim ) return CostLim;
    // positive cofactor
    for ( c = 0; c < nWords; c++ )
        uOn2[c] = pOn[c+nWords] & ~pOnDc[c];
    Cost1 = Abc_IsopCheck( uOn2, pOnDc+nWords, uRes1, nVars, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) : NULL );
    if ( Cost0 + Cost1 >= CostLim ) return CostLim;
    // middle cofactor
    for ( c = 0; c < nWords; c++ )
        uOn2[c] = (pOn[c] & ~uRes0[c]) | (pOn[c+nWords] & ~uRes1[c]), uOnDc2[c] = pOnDc[c] & pOnDc[c+nWords];
    Cost2 = Abc_IsopCheck( uOn2, uOnDc2,       uRes2, nVars, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1) : NULL );
    if ( Cost0 + Cost1 + Cost2 >= CostLim ) return CostLim;
    // derive the final truth table
    for ( c = 0; c < nWords; c++ )
        pRes[c] = uRes2[c] | uRes0[c], pRes[c+nWords] = uRes2[c] | uRes1[c];
    // verify
    for ( c = 0; c < (nWords<<1); c++ )
        assert( (pOn[c]  & ~pRes[c] ) == 0 && (pRes[c] & ~pOnDc[c]) == 0 );
    Abc_IsopAddLits( pCover, Cost0, Cost1, nVars );
    return Cost0 + Cost1 + Cost2 + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1);
}